

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

AdaptEcdsaAdaptorRequest * __thiscall
cfd::js::api::json::AdaptEcdsaAdaptorRequest::GetAdaptorSignatureString_abi_cxx11_
          (AdaptEcdsaAdaptorRequest *this,AdaptEcdsaAdaptorRequest *obj)

{
  AdaptEcdsaAdaptorRequest *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->adaptor_signature_);
  return this;
}

Assistant:

static std::string GetAdaptorSignatureString(  // line separate
      const AdaptEcdsaAdaptorRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.adaptor_signature_);
  }